

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# limbo.cpp
# Opt level: O3

vector<field::GF2E,_std::allocator<field::GF2E>_> *
anon_unknown.dwarf_3dcb0::phase_1_expand
          (vector<field::GF2E,_std::allocator<field::GF2E>_> *__return_storage_ptr__,
          limbo_instance_t *instance,vector<unsigned_char,_std::allocator<unsigned_char>_> *h_1,
          uint nbChallenges)

{
  BitSequence *data;
  undefined4 extraout_EAX;
  undefined4 extraout_EAX_00;
  undefined4 extraout_EAX_01;
  undefined4 uVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 uVar2;
  uint capacity;
  uint rate;
  long lVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> lambda_sized_buffer;
  hash_context ctx;
  allocator_type local_159;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_158;
  Keccak_HashInstance local_140;
  
  if (instance->digest_size == 0x20) {
    rate = 0x540;
    capacity = 0x100;
  }
  else {
    rate = 0x440;
    capacity = 0x200;
  }
  Keccak_HashInitialize(&local_140,rate,capacity,0,'\x1f');
  data = (h_1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
         super__Vector_impl_data._M_start;
  Keccak_HashUpdate(&local_140,data,
                    ((long)(h_1->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                           _M_impl.super__Vector_impl_data._M_finish - (long)data) * 8);
  Keccak_HashFinal(&local_140,(BitSequence *)0x0);
  std::vector<field::GF2E,_std::allocator<field::GF2E>_>::vector
            (__return_storage_ptr__,(ulong)nbChallenges,(allocator_type *)&local_158);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_158,(ulong)instance->lambda,&local_159);
  std::vector<field::GF2E,_std::allocator<field::GF2E>_>::reserve
            (__return_storage_ptr__,(ulong)instance->num_rounds);
  uVar1 = extraout_EAX;
  uVar2 = extraout_var;
  if (nbChallenges != 0) {
    lVar3 = 0;
    do {
      Keccak_HashSqueeze(&local_140,
                         local_158.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         ((long)local_158.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)local_158.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start) * 8);
      field::GF2E::from_bytes
                ((GF2E *)((long)&((__return_storage_ptr__->
                                  super__Vector_base<field::GF2E,_std::allocator<field::GF2E>_>).
                                  _M_impl.super__Vector_impl_data._M_start)->data + lVar3),
                 local_158.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                 .super__Vector_impl_data._M_start);
      lVar3 = lVar3 + 8;
      uVar1 = extraout_EAX_00;
      uVar2 = extraout_var_00;
    } while ((ulong)nbChallenges << 3 != lVar3);
  }
  if (local_158.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (BitSequence *)0x0) {
    operator_delete(local_158.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_158.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_158.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
    uVar1 = extraout_EAX_01;
    uVar2 = extraout_var_01;
  }
  return (vector<field::GF2E,_std::allocator<field::GF2E>_> *)CONCAT44(uVar2,uVar1);
}

Assistant:

std::vector<field::GF2E> phase_1_expand(const limbo_instance_t &instance,
                                        const std::vector<uint8_t> &h_1,
                                        unsigned int nbChallenges) {
  hash_context ctx;
  hash_init(&ctx, instance.digest_size);
  hash_update(&ctx, h_1.data(), h_1.size());
  hash_final(&ctx);

  std::vector<field::GF2E> r_ejs(nbChallenges);
  std::vector<uint8_t> lambda_sized_buffer(instance.lambda);
  r_ejs.reserve(instance.num_rounds);
  for (size_t e = 0; e < nbChallenges; e++) {
    hash_squeeze(&ctx, lambda_sized_buffer.data(), lambda_sized_buffer.size());
    r_ejs[e].from_bytes(lambda_sized_buffer.data());
  }
  return r_ejs;
}